

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
ptc::Print<char16_t>::operator()
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,Print<char16_t> *this,mode *first,char (*args) [8],
          char (*args_1) [5])

{
  _func_int *p_Var1;
  int iVar2;
  undefined8 uVar3;
  conditional_t<std::is_same_v<char16_t,_char>,_const_std::basic_string<char16_t>_&,_std::basic_string<char16_t>_>
  local_68;
  string local_48;
  
  if (*first == str) {
    if (operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
        oss_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::
        basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
        basic_ostringstream(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::
                     basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                     ::~basic_ostringstream,
                     &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    anon_unknown_8::StringConverter<char16_t>(&local_68,&local_48);
    std::__cxx11::basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    str((basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
        &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
         oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.field_0x8,
        &local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 2 + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    p_Var1 = operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
             ::oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.
             _vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x15c050) = (uint)(*(long *)(p_Var1 + 0x15c118) == 0);
    if ((*(uint *)(p_Var1 + 0x15c04c) & (uint)(*(long *)(p_Var1 + 0x15c118) == 0)) != 0) {
      uVar3 = std::__throw_ios_failure("basic_ios::clear");
      __cxa_guard_abort(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                         ::oss_abi_cxx11_);
      _Unwind_Resume(uVar3);
    }
    print_backend<std::__cxx11::basic_ostringstream<char16_t,std::char_traits<char16_t>,std::allocator<char16_t>>&,char_const(&)[8],char_const(&)[5]>
              (this,&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                     ::oss_abi_cxx11_,args,args_1);
    std::__cxx11::basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    str(__return_storage_ptr__,
        (basic_stringbuf<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
        &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
         oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.field_0x8);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    anon_unknown_8::StringConverter<char16_t>(__return_storage_ptr__,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }